

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationZ.hpp
# Opt level: O2

void __thiscall
qclab::qgates::CRotationZ<std::complex<float>_>::CRotationZ(CRotationZ<std::complex<float>_> *this)

{
  undefined4 local_c;
  undefined8 local_8;
  
  (this->super_QControlledGate2<std::complex<float>_>).control_ = 0;
  (this->super_QControlledGate2<std::complex<float>_>).controlState_ = 1;
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_004d2330;
  local_c = 1;
  local_8 = 0;
  std::make_unique<qclab::qgates::RotationZ<std::complex<float>>,int,double>
            ((int *)&this->gate_,(double *)&local_c);
  return;
}

Assistant:

CRotationZ()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< RotationZ< T > >( 1 , 0. ) )
        { }